

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateDebugInfoOperand
          (ValidationState_t *_,string *debug_inst_name,
          CommonDebugInfoInstructions expected_debug_inst,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  ostream *poVar1;
  bool bVar2;
  spv_result_t sVar3;
  DiagnosticStream *pDVar4;
  spv_ext_inst_desc desc;
  spv_ext_inst_desc local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [32];
  DiagnosticStream local_208;
  
  local_228._8_8_ = (spv_const_validator_options)0x0;
  local_228._4_4_ = 0;
  local_228._0_4_ = expected_debug_inst;
  local_228._24_8_ =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:186:7)>
       ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:186:7)>
       ::_M_manager;
  bVar2 = DoesDebugInfoOperandMatchExpectation
                    ((anon_unknown_0 *)_,(ValidationState_t *)local_228,
                     (function<bool_(CommonDebugInfoInstructions)> *)
                     (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (Instruction *)
                     (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,word_index);
  sVar3 = SPV_SUCCESS;
  if (!bVar2) {
    local_250 = (spv_ext_inst_desc)0x0;
    sVar3 = AssemblyGrammar::lookupExtInst
                      (&_->grammar_,(inst->inst_).ext_inst_type,expected_debug_inst,&local_250);
    if ((sVar3 == SPV_SUCCESS) && (local_250 != (spv_ext_inst_desc)0x0)) {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x20),_,SPV_ERROR_INVALID_DATA,inst);
      if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001deede:
        std::__throw_bad_function_call();
      }
      (*ext_inst_name->_M_invoker)(&local_248,(_Any_data *)ext_inst_name);
      pDVar4 = (DiagnosticStream *)(local_228 + 0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar4,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar4,"expected operand ",0x11)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar4,(debug_inst_name->_M_dataplus)._M_p,
                 debug_inst_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar4," must be a result id of ",0x18);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_250->name);
      sVar3 = pDVar4->error_;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)(local_228 + 0x20),_,SPV_ERROR_INVALID_DATA,inst);
      if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001deede;
      (*ext_inst_name->_M_invoker)(&local_248,(_Any_data *)ext_inst_name);
      poVar1 = (ostream *)(local_228 + 0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"expected operand ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(debug_inst_name->_M_dataplus)._M_p,debug_inst_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," is invalid",0xb);
      sVar3 = local_208.error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)(local_228 + 0x20));
  }
  if ((code *)local_228._16_8_ != (code *)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  return sVar3;
}

Assistant:

spv_result_t ValidateDebugInfoOperand(
    ValidationState_t& _, const std::string& debug_inst_name,
    CommonDebugInfoInstructions expected_debug_inst, const Instruction* inst,
    uint32_t word_index, const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [expected_debug_inst](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == expected_debug_inst;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(inst->ext_inst_type(), expected_debug_inst,
                                &desc) != SPV_SUCCESS ||
      !desc) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": "
           << "expected operand " << debug_inst_name << " is invalid";
  }
  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name << " must be a result id of "
         << desc->name;
}